

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_decoder.cpp
# Opt level: O2

void __thiscall zmq::v1_decoder_t::~v1_decoder_t(v1_decoder_t *this)

{
  int iVar1;
  int *piVar2;
  char *errmsg_;
  int in_ESI;
  
  iVar1 = msg_t::close(&this->_in_progress,in_ESI);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    errmsg_ = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
            ,0x38);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>::~decoder_base_t
            (&this->super_decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>);
  return;
}

Assistant:

zmq::v1_decoder_t::~v1_decoder_t ()
{
    const int rc = _in_progress.close ();
    errno_assert (rc == 0);
}